

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type * __thiscall
FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>::
fastAccessDx(value_type *__return_storage_ptr__,
            FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>
            *this,int i)

{
  Fad<double> *pFVar1;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_98;
  value_type local_88;
  value_type local_68;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_48;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  local_38;
  
  pFVar1 = (this->left_->dx_).ptr_to_data;
  FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>::val(&local_68,&this->right_->fadexpr_);
  local_98.fadexpr_.left_ = pFVar1 + i;
  local_98.fadexpr_.right_ = &local_68;
  FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>::fastAccessDx
            (&local_88,&this->right_->fadexpr_,i);
  local_48.fadexpr_.right_ = &this->left_->val_;
  local_38.fadexpr_.right_ = &local_48;
  local_48.fadexpr_.left_ = &local_88;
  local_38.fadexpr_.left_ = &local_98;
  Fad<double>::
  Fad<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>
            (__return_storage_ptr__,&local_38);
  Fad<double>::~Fad(&local_88);
  Fad<double>::~Fad(&local_68);
  return __return_storage_ptr__;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}